

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.c
# Opt level: O0

int ecs_parse_signature_action
              (ecs_world_t *world,char *name,char *expr,int64_t column,ecs_sig_from_kind_t from_kind
              ,ecs_sig_oper_kind_t oper_kind,ecs_sig_inout_kind_t inout_kind,ecs_entity_t role,
              char *entity_id,char *source_id,char *trait_id,char *arg_name,void *data)

{
  bool bVar1;
  int iVar2;
  ecs_entity_t eVar3;
  ecs_entity_t trait;
  ecs_entity_t component;
  ecs_entity_t source;
  _Bool is_singleton;
  ecs_sig_t *sig;
  ecs_sig_oper_kind_t oper_kind_local;
  ecs_sig_from_kind_t from_kind_local;
  int64_t column_local;
  char *expr_local;
  char *name_local;
  ecs_world_t *world_local;
  
  bVar1 = false;
  _ecs_assert(data != (void *)0x0,0xc,(char *)0x0,"sig != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/signature.c"
              ,0x235);
  if (data == (void *)0x0) {
    __assert_fail("sig != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/signature.c"
                  ,0x235,
                  "int ecs_parse_signature_action(ecs_world_t *, const char *, const char *, int64_t, ecs_sig_from_kind_t, ecs_sig_oper_kind_t, ecs_sig_inout_kind_t, ecs_entity_t, const char *, const char *, const char *, const char *, void *)"
                 );
  }
  sig._4_4_ = from_kind;
  if (*entity_id == '$') {
    if (from_kind == EcsFromEntity) {
      _ecs_parser_error(name,expr,column,"singleton component \'%s\' cannot have a source",entity_id
                       );
      abort();
    }
    sig._4_4_ = EcsFromEntity;
    bVar1 = true;
    entity_id = entity_id + 1;
  }
  component = 0;
  trait = ecs_lookup_path_w_sep(world,0,entity_id,".",(char *)0x0);
  if (trait == 0) {
    iVar2 = strcmp(entity_id,"0");
    if (iVar2 != 0) {
      _ecs_parser_error(name,expr,column,"unresolved component identifier \'%s\'",entity_id);
      abort();
    }
    world_local._4_4_ = 0;
  }
  else {
    if (bVar1) {
      component = trait;
    }
    if (trait_id != (char *)0x0) {
      eVar3 = ecs_lookup_path_w_sep(world,0,trait_id,".",(char *)0x0);
      if (eVar3 == 0) {
        _ecs_parser_error(name,expr,column,"unresolved trait identifier \'%s\'",trait_id);
        abort();
      }
      trait = (eVar3 << 0x20) + (trait & 0xffffffff);
    }
    if (((component == 0) && (sig._4_4_ == EcsFromEntity)) &&
       (component = ecs_lookup_path_w_sep(world,0,source_id,".",(char *)0x0), component == 0)) {
      _ecs_parser_error(name,expr,column,"unresolved source identifier \'%s\'",source_id);
      abort();
    }
    world_local._4_4_ =
         ecs_sig_add(world,(ecs_sig_t *)data,sig._4_4_,oper_kind,inout_kind,role | trait,component,
                     arg_name);
  }
  return world_local._4_4_;
}

Assistant:

static
int ecs_parse_signature_action(
    ecs_world_t *world,
    const char *name,
    const char *expr,
    int64_t column,
    ecs_sig_from_kind_t from_kind,
    ecs_sig_oper_kind_t oper_kind,
    ecs_sig_inout_kind_t inout_kind,
    ecs_entity_t role,
    const char *entity_id,
    const char *source_id,
    const char *trait_id,
    const char *arg_name,
    void *data)
{
    ecs_sig_t *sig = data;
    bool is_singleton = false;

    ecs_assert(sig != NULL, ECS_INTERNAL_ERROR, NULL);

    if (entity_id[0] == '$') {
        if (from_kind ==  EcsFromEntity) {
            ecs_parser_error(name, expr, column, 
                "singleton component '%s' cannot have a source", entity_id);
        }

        from_kind = EcsFromEntity;
        is_singleton = true;
        entity_id ++;
    }

    /* Lookup component handle by string identifier */
    ecs_entity_t source = 0, component = ecs_lookup_fullpath(world, entity_id);
    if (!component) {
        /* "0" is a valid expression used to indicate that a system matches no
         * components */
        if (!strcmp(entity_id, "0")) {
            /* No need to add 0 component to signature */
            return 0;
        } else {
            ecs_parser_error(name, expr, column, 
                "unresolved component identifier '%s'", entity_id);
        }
    }

    if (is_singleton) {
        source = component;
    }

    /* Lookup trait handle by string identifier */
    if (trait_id) {
        ecs_entity_t trait = ecs_lookup_fullpath(world, trait_id);
        if (!trait) {
            ecs_parser_error(name, expr, column, 
                "unresolved trait identifier '%s'", trait_id);
        } else {
            component = ecs_entity_t_comb(component, trait);
        }
    }

    component |= role;

    if (!source && from_kind == EcsFromEntity) {
        source = ecs_lookup_fullpath(world, source_id);
        if (!source) {
            ecs_parser_error(name, expr, column, 
                "unresolved source identifier '%s'", source_id);
        }
    }

    return ecs_sig_add(
        world, sig, from_kind, oper_kind, inout_kind, component, source, 
        arg_name);
}